

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int CVodeSetLinearSolver(void *cvode_mem,SUNLinearSolver LS,SUNMatrix A)

{
  long lVar1;
  SUNLinearSolver_Type SVar2;
  int iVar3;
  sunindextype sVar4;
  uint *__ptr;
  SUNLinearSolver_Ops p_Var5;
  N_Vector v;
  N_Vector p_Var6;
  SUNMatrix p_Var7;
  SUNMatrix p_Var8;
  uint uVar9;
  char *pcVar10;
  bool bVar11;
  double dVar12;
  
  if (cvode_mem == (void *)0x0) {
    pcVar10 = "Integrator memory is NULL.";
    iVar3 = -1;
  }
  else {
    if (LS != (SUNLinearSolver)0x0) {
      if ((LS->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
         (LS->ops->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_realtype *)0x0))
      {
        pcVar10 = "LS object is missing a required operation";
      }
      else {
        SVar2 = SUNLinSolGetType(LS);
        bVar11 = (SVar2 - SUNLINEARSOLVER_ITERATIVE & 0xfffffffd) != 0;
        lVar1 = *(long *)(*(long *)((long)cvode_mem + 0xe0) + 8);
        if ((*(long *)(lVar1 + 0x58) == 0) || (*(long *)(lVar1 + 0xa0) == 0)) {
LAB_004d08a5:
          pcVar10 = "A required vector operation is not implemented.";
        }
        else if (A == (SUNMatrix)0x0 || SVar2 != SUNLINEARSOLVER_MATRIX_EMBEDDED) {
          if (SVar2 == SUNLINEARSOLVER_DIRECT) {
            if (A != (SUNMatrix)0x0) {
LAB_004d08e3:
              if (*(code **)((long)cvode_mem + 0x400) != (code *)0x0) {
                (**(code **)((long)cvode_mem + 0x400))(cvode_mem);
              }
              *(code **)((long)cvode_mem + 1000) = cvLsInitialize;
              *(code **)((long)cvode_mem + 0x3f0) = cvLsSetup;
              *(code **)((long)cvode_mem + 0x3f8) = cvLsSolve;
              *(code **)((long)cvode_mem + 0x400) = cvLsFree;
              __ptr = (uint *)calloc(1,0x138);
              if (__ptr == (uint *)0x0) {
                pcVar10 = "A memory request failed.";
                iVar3 = -4;
                goto LAB_004d08c0;
              }
              *(SUNLinearSolver *)(__ptr + 0x12) = LS;
              *__ptr = (uint)(SVar2 != SUNLINEARSOLVER_DIRECT);
              __ptr[1] = (uint)bVar11;
              p_Var7 = A;
              p_Var8 = A;
              if (A != (SUNMatrix)0x0) {
                p_Var7 = (SUNMatrix)cvLsDQJac;
                p_Var8 = (SUNMatrix)cvode_mem;
              }
              __ptr[2] = (uint)(A != (SUNMatrix)0x0);
              *(SUNMatrix *)(__ptr + 4) = p_Var7;
              *(SUNMatrix *)(__ptr + 6) = p_Var8;
              uVar9 = 1;
              __ptr[0x3c] = 1;
              __ptr[0x3e] = 0;
              __ptr[0x3f] = 0;
              *(code **)(__ptr + 0x40) = cvLsDQJtimes;
              *(undefined8 *)(__ptr + 0x42) = *(undefined8 *)((long)cvode_mem + 0x10);
              *(void **)(__ptr + 0x44) = cvode_mem;
              __ptr[0x46] = 0;
              *(code **)(__ptr + 0x48) = cvLsLinSys;
              *(void **)(__ptr + 0x4a) = cvode_mem;
              __ptr[0x38] = 0;
              __ptr[0x39] = 0;
              __ptr[0x34] = 0;
              __ptr[0x35] = 0;
              __ptr[0x36] = 0;
              __ptr[0x37] = 0;
              *(undefined8 *)(__ptr + 0x3a) = *(undefined8 *)((long)cvode_mem + 0x18);
              __ptr[0x22] = 0;
              __ptr[0x23] = 0;
              __ptr[0x24] = 0;
              __ptr[0x25] = 0;
              __ptr[0x26] = 0;
              __ptr[0x27] = 0;
              __ptr[0x28] = 0;
              __ptr[0x29] = 0;
              __ptr[0x2a] = 0;
              __ptr[0x2b] = 0;
              __ptr[0x2c] = 0;
              __ptr[0x2d] = 0;
              __ptr[0x2e] = 0;
              __ptr[0x2f] = 0;
              __ptr[0x30] = 0;
              __ptr[0x31] = 0;
              __ptr[0x32] = 0;
              __ptr[0x33] = 0;
              __ptr[0x20] = 0x33;
              __ptr[0x21] = 0;
              __ptr[8] = 1;
              __ptr[10] = 0x9999999a;
              __ptr[0xb] = 0x3fc99999;
              __ptr[0xe] = 0x9999999a;
              __ptr[0xf] = 0x3fa99999;
              __ptr[0x4c] = 0;
              p_Var5 = LS->ops;
              if (p_Var5->setatimes == (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
LAB_004d0ac7:
                if ((p_Var5->setpreconditioner !=
                     (_func_int_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) &&
                   (iVar3 = SUNLinSolSetPreconditioner
                                      (LS,cvode_mem,(SUNPSetupFn)0x0,(SUNPSolveFn)0x0), iVar3 != 0))
                {
                  pcVar10 = "Error in calling SUNLinSolSetPreconditioner";
                  goto LAB_004d0af6;
                }
                if (A != (SUNMatrix)0x0) {
                  *(SUNMatrix *)(__ptr + 0x14) = A;
                  __ptr[0x16] = 0;
                  __ptr[0x17] = 0;
                }
                v = N_VClone(*(N_Vector *)((long)cvode_mem + 0xe0));
                *(N_Vector *)(__ptr + 0x18) = v;
                if (v != (N_Vector)0x0) {
                  p_Var6 = N_VClone(*(N_Vector *)((long)cvode_mem + 0xe0));
                  *(N_Vector *)(__ptr + 0x1a) = p_Var6;
                  if (p_Var6 == (N_Vector)0x0) {
                    iVar3 = -4;
                    cvProcessError((CVodeMem)cvode_mem,-4,"CVLS","CVodeSetLinearSolver",
                                   "A memory request failed.");
                    N_VDestroy(v);
                    goto LAB_004d0b05;
                  }
                  if (SVar2 == SUNLINEARSOLVER_DIRECT) {
LAB_004d0c04:
                    if (*(int *)((long)cvode_mem + 0x20) == 2) goto LAB_004d0c0c;
                  }
                  else {
                    sVar4 = N_VGetLength(v);
                    if (sVar4 < 1) {
                      dVar12 = 0.0;
                    }
                    else {
                      sVar4 = N_VGetLength(v);
                      dVar12 = (double)sVar4;
                      if (dVar12 < 0.0) {
                        dVar12 = sqrt(dVar12);
                      }
                      else {
                        dVar12 = SQRT(dVar12);
                      }
                    }
                    *(double *)(__ptr + 0x10) = dVar12;
                    if ((SVar2 | SUNLINEARSOLVER_MATRIX_ITERATIVE) !=
                        SUNLINEARSOLVER_MATRIX_EMBEDDED) goto LAB_004d0c04;
                  }
                  uVar9 = 0;
LAB_004d0c0c:
                  __ptr[0xc] = uVar9;
                  *(uint **)((long)cvode_mem + 0x408) = __ptr;
                  return 0;
                }
                pcVar10 = "A memory request failed.";
                iVar3 = -4;
              }
              else {
                iVar3 = SUNLinSolSetATimes(LS,cvode_mem,cvLsATimes);
                if (iVar3 == 0) {
                  p_Var5 = LS->ops;
                  goto LAB_004d0ac7;
                }
                pcVar10 = "Error in calling SUNLinSolSetATimes";
LAB_004d0af6:
                iVar3 = -9;
              }
              cvProcessError((CVodeMem)cvode_mem,iVar3,"CVLS","CVodeSetLinearSolver",pcVar10);
LAB_004d0b05:
              free(__ptr);
              return iVar3;
            }
            pcVar10 = "Incompatible inputs: direct LS requires non-NULL matrix";
          }
          else {
            if (*(long *)(lVar1 + 0x48) == 0) goto LAB_004d08a5;
            if (((SVar2 != SUNLINEARSOLVER_MATRIX_EMBEDDED) == bVar11) ||
               (LS->ops->setatimes != (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)) {
              if ((A != (SUNMatrix)0x0) ||
                 ((SVar2 | SUNLINEARSOLVER_MATRIX_ITERATIVE) == SUNLINEARSOLVER_MATRIX_EMBEDDED))
              goto LAB_004d08e3;
              pcVar10 = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
            }
            else {
              pcVar10 = "Incompatible inputs: iterative LS must support ATimes routine";
            }
          }
        }
        else {
          pcVar10 = "Incompatible inputs: matrix-embedded LS requires NULL matrix";
        }
      }
      iVar3 = -3;
      goto LAB_004d08c0;
    }
    pcVar10 = "LS must be non-NULL";
    iVar3 = -3;
  }
  cvode_mem = (CVodeMem)0x0;
LAB_004d08c0:
  cvProcessError((CVodeMem)cvode_mem,iVar3,"CVLS","CVodeSetLinearSolver",pcVar10);
  return iVar3;
}

Assistant:

int CVodeSetLinearSolver(void *cvode_mem, SUNLinearSolver LS,
                         SUNMatrix A)
{
  CVodeMem    cv_mem;
  CVLsMem     cvls_mem;
  int         retval, LSType;
  booleantype iterative;    /* is the solver iterative?    */
  booleantype matrixbased;  /* is a matrix structure used? */

  /* Return immediately if either cvode_mem or LS inputs are NULL */
  if (cvode_mem == NULL) {
    cvProcessError(NULL, CVLS_MEM_NULL, "CVLS",
                   "CVodeSetLinearSolver", MSG_LS_CVMEM_NULL);
    return(CVLS_MEM_NULL);
  }
  if (LS == NULL) {
    cvProcessError(NULL, CVLS_ILL_INPUT, "CVLS",
                   "CVodeSetLinearSolver",
                   "LS must be non-NULL");
    return(CVLS_ILL_INPUT);
  }
  cv_mem = (CVodeMem) cvode_mem;

  /* Test if solver is compatible with LS interface */
  if ( (LS->ops->gettype == NULL) || (LS->ops->solve == NULL) ) {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS",
                   "CVodeSetLinearSolver",
                   "LS object is missing a required operation");
    return(CVLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if ( (cv_mem->cv_tempv->ops->nvconst == NULL) ||
       (cv_mem->cv_tempv->ops->nvwrmsnorm == NULL) ) {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS",
                   "CVodeSetLinearSolver", MSG_LS_BAD_NVECTOR);
    return(CVLS_ILL_INPUT);
  }

  /* Ensure that A is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (A != NULL)) {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS", "CVodeSetLinearSolver",
                    "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return(CVLS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative) {

    if (cv_mem->cv_tempv->ops->nvgetlength == NULL) {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS",
                     "CVodeSetLinearSolver", MSG_LS_BAD_NVECTOR);
      return(CVLS_ILL_INPUT);
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL)) {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS", "CVodeSetLinearSolver",
                     "Incompatible inputs: iterative LS must support ATimes routine");
      return(CVLS_ILL_INPUT);
    }

    if (matrixbased && (A == NULL)) {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS", "CVodeSetLinearSolver",
                     "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return(CVLS_ILL_INPUT);
    }

  } else if (A == NULL) {

    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS", "CVodeSetLinearSolver",
                   "Incompatible inputs: direct LS requires non-NULL matrix");
    return(CVLS_ILL_INPUT);

  }

  /* free any existing system solver attached to CVode */
  if (cv_mem->cv_lfree)  cv_mem->cv_lfree(cv_mem);

  /* Set four main system linear solver function fields in cv_mem */
  cv_mem->cv_linit  = cvLsInitialize;
  cv_mem->cv_lsetup = cvLsSetup;
  cv_mem->cv_lsolve = cvLsSolve;
  cv_mem->cv_lfree  = cvLsFree;

  /* Allocate memory for CVLsMemRec */
  cvls_mem = NULL;
  cvls_mem = (CVLsMem) malloc(sizeof(struct CVLsMemRec));
  if (cvls_mem == NULL) {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, "CVLS",
                    "CVodeSetLinearSolver", MSG_LS_MEM_FAIL);
    return(CVLS_MEM_FAIL);
  }
  memset(cvls_mem, 0, sizeof(struct CVLsMemRec));

  /* set SUNLinearSolver pointer */
  cvls_mem->LS = LS;

  /* Linear solver type information */
  cvls_mem->iterative   = iterative;
  cvls_mem->matrixbased = matrixbased;

  /* Set defaults for Jacobian-related fields */
  if (A != NULL) {
    cvls_mem->jacDQ  = SUNTRUE;
    cvls_mem->jac    = cvLsDQJac;
    cvls_mem->J_data = cv_mem;
  } else {
    cvls_mem->jacDQ  = SUNFALSE;
    cvls_mem->jac    = NULL;
    cvls_mem->J_data = NULL;
  }

  cvls_mem->jtimesDQ = SUNTRUE;
  cvls_mem->jtsetup  = NULL;
  cvls_mem->jtimes   = cvLsDQJtimes;
  cvls_mem->jt_f     = cv_mem->cv_f;
  cvls_mem->jt_data  = cv_mem;

  cvls_mem->user_linsys = SUNFALSE;
  cvls_mem->linsys      = cvLsLinSys;
  cvls_mem->A_data      = cv_mem;

  /* Set defaults for preconditioner-related fields */
  cvls_mem->pset   = NULL;
  cvls_mem->psolve = NULL;
  cvls_mem->pfree  = NULL;
  cvls_mem->P_data = cv_mem->cv_user_data;

  /* Initialize counters */
  cvLsInitializeCounters(cvls_mem);

  /* Set default values for the rest of the LS parameters */
  cvls_mem->msbj       = CVLS_MSBJ;
  cvls_mem->jbad       = SUNTRUE;
  cvls_mem->dgmax_jbad = CVLS_DGMAX;
  cvls_mem->eplifac    = CVLS_EPLIN;
  cvls_mem->last_flag  = CVLS_SUCCESS;

  /* If LS supports ATimes, attach CVLs routine */
  if (LS->ops->setatimes) {
    retval = SUNLinSolSetATimes(LS, cv_mem, cvLsATimes);
    if (retval != SUNLS_SUCCESS) {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, "CVLS",
                     "CVodeSetLinearSolver",
                     "Error in calling SUNLinSolSetATimes");
      free(cvls_mem); cvls_mem = NULL;
      return(CVLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner) {
    retval = SUNLinSolSetPreconditioner(LS, cv_mem, NULL, NULL);
    if (retval != SUNLS_SUCCESS) {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, "CVLS",
                     "CVodeSetLinearSolver",
                     "Error in calling SUNLinSolSetPreconditioner");
      free(cvls_mem); cvls_mem = NULL;
      return(CVLS_SUNLS_FAIL);
    }
  }

  /* When using a SUNMatrix object, store pointer to A and initialize savedJ */
  if (A != NULL) {
    cvls_mem->A = A;
    cvls_mem->savedJ = NULL; /* allocated in cvLsInitialize */
  }

  /* Allocate memory for ytemp and x */
  cvls_mem->ytemp = N_VClone(cv_mem->cv_tempv);
  if (cvls_mem->ytemp == NULL) {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, "CVLS",
                    "CVodeSetLinearSolver", MSG_LS_MEM_FAIL);
    free(cvls_mem); cvls_mem = NULL;
    return(CVLS_MEM_FAIL);
  }

  cvls_mem->x = N_VClone(cv_mem->cv_tempv);
  if (cvls_mem->x == NULL) {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, "CVLS",
                    "CVodeSetLinearSolver", MSG_LS_MEM_FAIL);
    N_VDestroy(cvls_mem->ytemp);
    free(cvls_mem); cvls_mem = NULL;
    return(CVLS_MEM_FAIL);
  }

  /* For iterative LS, compute default norm conversion factor */
  if (iterative)
    cvls_mem->nrmfac = SUNRsqrt( N_VGetLength(cvls_mem->ytemp) );

  /* Check if solution scaling should be enabled */
  if (matrixbased && cv_mem->cv_lmm == CV_BDF)
    cvls_mem->scalesol = SUNTRUE;
  else
    cvls_mem->scalesol = SUNFALSE;

  /* Attach linear solver memory to integrator memory */
  cv_mem->cv_lmem = cvls_mem;

  return(CVLS_SUCCESS);
}